

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  BYTE *prefixStart;
  BYTE *dictEnd;
  undefined8 uVar6;
  seq_t sequence;
  seq_t sequence_00;
  bool bVar7;
  size_t sVar8;
  size_t sVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  long lVar14;
  BYTE *pBVar15;
  uint uVar16;
  size_t sVar17;
  BYTE *pBVar18;
  BYTE *oend;
  ulong uVar19;
  ulong uVar20;
  BYTE *pBVar21;
  uint uVar22;
  void *src_00;
  ulong uVar23;
  BYTE *op;
  ulong *puVar24;
  size_t seqSize;
  byte *pbVar25;
  ulong uVar26;
  BYTE *pBVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  ulong *puVar31;
  BYTE *litPtr;
  int nbSeq;
  seq_t sequences [8];
  ZSTD_longOffset_e in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdd0;
  BIT_DStream_t local_1d8;
  ZSTD_fseState local_1b0;
  ZSTD_fseState local_1a0;
  ZSTD_fseState local_190;
  ulong local_180 [4];
  ulong *local_160;
  ulong local_158;
  BYTE *local_150;
  ulong local_148;
  ZSTD_DCtx *local_140;
  BYTE *local_138;
  int local_12c;
  ulong *local_128;
  BYTE *local_120;
  byte *local_118;
  ulong local_110;
  long local_108;
  int local_fc;
  ulong local_f8;
  size_t local_f0;
  ulong local_e8 [23];
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  local_140 = dctx;
  sVar8 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  src_00 = (void *)((long)src + sVar8);
  sVar8 = srcSize - sVar8;
  iVar28 = local_140->ddictIsCold;
  sVar9 = ZSTD_decodeSeqHeaders(local_140,&local_fc,src_00,sVar8);
  if (0xffffffffffffff88 < sVar9) {
    return sVar9;
  }
  if (dst == (void *)0x0 && 0 < local_fc) {
    return 0xffffffffffffffba;
  }
  puVar24 = (ulong *)(sVar9 + (long)src_00);
  seqSize = sVar8 - sVar9;
  if (iVar28 == 0) {
    if (frame == 0) {
      if (8 < local_fc) goto LAB_007298b4;
    }
    else if (0x1000000 < (local_140->fParams).windowSize && 8 < local_fc) {
LAB_007298b4:
      iVar28 = 0;
      uVar30 = 1;
      do {
        iVar28 = (iVar28 + 1) -
                 (uint)(local_140->OFTptr[(ulong)(uVar30 - 1) + 1].nbAdditionalBits < 0x17);
        bVar10 = (byte)local_140->OFTptr->baseValue;
        uVar22 = uVar30 >> (bVar10 & 0x1f);
        uVar30 = uVar30 + 1;
      } while (uVar22 == 0);
      local_140->ddictIsCold = 0;
      if ((uint)(iVar28 << (8 - bVar10 & 0x1f)) < 7) goto LAB_00729992;
      goto LAB_007297c8;
    }
    local_140->ddictIsCold = 0;
LAB_00729992:
    sVar8 = ZSTD_decompressSequences
                      (local_140,dst,dstCapacity,puVar24,seqSize,local_fc,in_stack_fffffffffffffdc8,
                       in_stack_fffffffffffffdd0);
    return sVar8;
  }
  local_140->ddictIsCold = 0;
LAB_007297c8:
  oend = (BYTE *)(dstCapacity + (long)dst);
  local_150 = local_140->litPtr;
  local_138 = local_150 + local_140->litSize;
  op = (BYTE *)dst;
  if (local_fc != 0) {
    prefixStart = (BYTE *)local_140->prefixStart;
    local_120 = (BYTE *)local_140->virtualStart;
    dictEnd = (BYTE *)local_140->dictEnd;
    local_140->fseEntropy = 1;
    lVar14 = -0xc;
    do {
      *(ulong *)((long)local_180 + lVar14 * 2 + 0x18) =
           (ulong)*(uint *)((long)(local_140->entropy).workspace + lVar14);
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0);
    iVar28 = 8;
    if (local_fc < 8) {
      iVar28 = local_fc;
    }
    if (sVar8 == sVar9) {
      local_1d8.ptr = (char *)0x0;
      local_1d8.start = (char *)0x0;
      local_1d8.bitContainer = 0;
      local_1d8.bitsConsumed = 0;
      local_1d8._12_4_ = 0;
      local_1d8.limitPtr = (char *)0x0;
    }
    else {
      local_1d8.limitPtr = (char *)(puVar24 + 1);
      local_1d8.start = (char *)puVar24;
      local_12c = iVar28;
      if (seqSize < 8) {
        local_1d8.bitContainer = (size_t)(byte)*puVar24;
        switch(seqSize) {
        case 7:
          local_1d8.bitContainer =
               (ulong)*(byte *)((long)puVar24 + 6) << 0x30 | local_1d8.bitContainer;
        case 6:
          local_1d8.bitContainer =
               local_1d8.bitContainer + ((ulong)*(byte *)((long)puVar24 + 5) << 0x28);
        case 5:
          local_1d8.bitContainer =
               local_1d8.bitContainer + ((ulong)*(byte *)((long)puVar24 + 4) << 0x20);
        case 4:
          local_1d8.bitContainer =
               local_1d8.bitContainer + (ulong)*(byte *)((long)puVar24 + 3) * 0x1000000;
        case 3:
          local_1d8.bitContainer =
               local_1d8.bitContainer + (ulong)*(byte *)((long)puVar24 + 2) * 0x10000;
        case 2:
          local_1d8.bitContainer =
               local_1d8.bitContainer + (ulong)*(byte *)((long)puVar24 + 1) * 0x100;
        }
        bVar10 = *(byte *)((long)src_00 + (sVar8 - 1));
        uVar30 = 0x1f;
        if (bVar10 != 0) {
          for (; bVar10 >> uVar30 == 0; uVar30 = uVar30 - 1) {
          }
        }
        local_1d8.bitsConsumed = ~uVar30 + 9;
        if (bVar10 == 0) {
          local_1d8.bitsConsumed = 0;
        }
        local_1d8.ptr = (char *)puVar24;
        if (bVar10 != 0) {
          local_1d8.bitsConsumed = local_1d8.bitsConsumed + (int)seqSize * -8 + 0x40;
LAB_00729a59:
          local_108 = (long)dst - (long)prefixStart;
          ZSTD_initFseState(&local_1b0,&local_1d8,local_140->LLTptr);
          ZSTD_initFseState(&local_1a0,&local_1d8,local_140->OFTptr);
          ZSTD_initFseState(&local_190,&local_1d8,local_140->MLTptr);
          pbVar25 = (byte *)(long)local_12c;
          puVar24 = local_e8;
          uVar20 = 0;
          do {
            uVar19 = local_180[1];
            uVar30 = local_1d8.bitsConsumed;
            if (local_1d8.bitsConsumed < 0x41) {
              if (local_1d8.ptr < local_1d8.limitPtr) {
                if (local_1d8.ptr == local_1d8.start) goto LAB_00729b51;
                uVar22 = (int)local_1d8.ptr - (int)local_1d8.start;
                if (local_1d8.start <=
                    (ulong *)((long)local_1d8.ptr - (ulong)(local_1d8.bitsConsumed >> 3))) {
                  uVar22 = local_1d8.bitsConsumed >> 3;
                }
                uVar16 = local_1d8.bitsConsumed + uVar22 * -8;
              }
              else {
                uVar22 = local_1d8.bitsConsumed >> 3;
                uVar16 = local_1d8.bitsConsumed & 7;
              }
              local_1d8.ptr = (char *)((long)local_1d8.ptr - (ulong)uVar22);
              local_1d8.bitsConsumed = uVar16;
              local_1d8.bitContainer = *(size_t *)local_1d8.ptr;
            }
LAB_00729b51:
            if ((0x40 < uVar30) || ((long)pbVar25 <= (long)uVar20)) goto LAB_00729e3b;
            uVar4 = local_1b0.table[local_1b0.state].nextState;
            bVar10 = local_1b0.table[local_1b0.state].nbAdditionalBits;
            bVar1 = local_1b0.table[local_1b0.state].nbBits;
            uVar23 = (ulong)local_1b0.table[local_1b0.state].baseValue;
            local_148 = (ulong)local_190.table[local_190.state].nextState;
            bVar12 = local_190.table[local_190.state].nbAdditionalBits;
            local_158 = CONCAT44(local_158._4_4_,(uint)local_190.table[local_190.state].nbBits);
            uVar26 = (ulong)local_190.table[local_190.state].baseValue;
            uVar5 = local_1a0.table[local_1a0.state].nextState;
            bVar2 = local_1a0.table[local_1a0.state].nbAdditionalBits;
            local_110 = CONCAT44(local_110._4_4_,(uint)local_1a0.table[local_1a0.state].nbBits);
            bVar11 = (byte)local_1d8.bitsConsumed;
            if (bVar2 < 2) {
              if (bVar2 == 0) {
                if (uVar23 == 0) {
                  local_180[1] = local_180[0];
                  goto LAB_00729c24;
                }
              }
              else {
                local_1d8.bitsConsumed = local_1d8.bitsConsumed + 1;
                lVar14 = (ulong)(local_1a0.table[local_1a0.state].baseValue + (uint)(uVar23 == 0)) -
                         ((long)(local_1d8.bitContainer << (bVar11 & 0x3f)) >> 0x3f);
                if (lVar14 == 3) {
                  uVar19 = local_180[0] - 1;
                }
                else {
                  uVar19 = local_180[lVar14];
                }
                if (lVar14 != 1) {
                  local_180[2] = local_180[1];
                }
                local_180[1] = local_180[0];
                local_180[0] = uVar19 + (uVar19 == 0);
              }
            }
            else {
              local_1d8.bitsConsumed = local_1d8.bitsConsumed + bVar2;
              local_180[1] = local_180[0];
              local_180[2] = uVar19;
              uVar19 = ((local_1d8.bitContainer << (bVar11 & 0x3f)) >> (-bVar2 & 0x3f)) +
                       (ulong)local_1a0.table[local_1a0.state].baseValue;
LAB_00729c24:
              local_180[1] = local_180[0];
              local_180[0] = uVar19;
            }
            uVar19 = local_180[0];
            if (bVar12 != 0) {
              bVar11 = (byte)local_1d8.bitsConsumed;
              local_1d8.bitsConsumed = local_1d8.bitsConsumed + bVar12;
              uVar26 = uVar26 + ((local_1d8.bitContainer << (bVar11 & 0x3f)) >> (-bVar12 & 0x3f));
            }
            if (0x1e < (byte)(bVar12 + bVar10 + bVar2)) {
              local_118 = pbVar25;
              BIT_reloadDStream(&local_1d8);
              pbVar25 = local_118;
            }
            if (bVar10 != 0) {
              bVar12 = (byte)local_1d8.bitsConsumed;
              local_1d8.bitsConsumed = local_1d8.bitsConsumed + bVar10;
              uVar23 = uVar23 + ((local_1d8.bitContainer << (bVar12 & 0x3f)) >> (-bVar10 & 0x3f));
            }
            iVar28 = bVar1 + local_1d8.bitsConsumed;
            iVar29 = iVar28 + (int)local_158;
            local_1b0.state =
                 (ulong)((uint)(local_1d8.bitContainer >> (-(char)iVar28 & 0x3fU)) & BIT_mask[bVar1]
                        ) + (ulong)uVar4;
            uVar30 = iVar29 + (int)local_110;
            local_190.state =
                 ((uint)(local_1d8.bitContainer >> (-(char)iVar29 & 0x3fU)) &
                 BIT_mask[local_158 & 0xffffffff]) + local_148;
            local_1a0.state =
                 (ulong)((uint)(local_1d8.bitContainer >> (-(char)uVar30 & 0x3fU)) &
                        BIT_mask[local_110 & 0xffffffff]) + (ulong)uVar5;
            local_1d8.bitsConsumed = uVar30;
            puVar24[-2] = uVar23;
            local_108 = local_108 + uVar23 + uVar26;
            puVar24[-1] = uVar26;
            *puVar24 = uVar19;
            uVar20 = uVar20 + 1;
            puVar24 = puVar24 + 3;
          } while( true );
        }
      }
      else {
        local_1d8.ptr = (char *)((sVar8 - 8) + (long)src_00);
        local_1d8.bitContainer = *(size_t *)local_1d8.ptr;
        bVar10 = *(byte *)((long)local_1d8.ptr + 7);
        uVar30 = 0x1f;
        if (bVar10 != 0) {
          for (; bVar10 >> uVar30 == 0; uVar30 = uVar30 - 1) {
          }
        }
        local_1d8.bitsConsumed = ~uVar30 + 9;
        if (bVar10 == 0) {
          local_1d8.bitsConsumed = 0;
        }
        bVar7 = false;
        puVar24 = (ulong *)0xffffffffffffffec;
        if (seqSize < 0xffffffffffffff89) {
          if (bVar10 != 0) goto LAB_00729a59;
          goto LAB_00729e4c;
        }
      }
    }
    goto LAB_00729e49;
  }
  goto LAB_00729e50;
joined_r0x0072a5f4:
  local_128 = puVar24;
  if (local_fc <= (int)uVar22) goto LAB_0072a8f2;
  uVar19 = (ulong)(uVar22 & 7);
  uVar20 = (&local_f8)[uVar19 * 3];
  pBVar18 = local_150 + uVar20;
  if (local_138 < pBVar18) {
LAB_0072a793:
    sequence_00.matchLength._0_4_ = (int)(&local_f0)[uVar19 * 3];
    sequence_00.litLength = (&local_f8)[uVar19 * 3];
    sequence_00.matchLength._4_4_ = (int)((&local_f0)[uVar19 * 3] >> 0x20);
    sequence_00.offset = local_e8[uVar19 * 3];
    puVar24 = (ulong *)ZSTD_execSequenceEnd
                                 (op,oend,sequence_00,&local_150,local_138,prefixStart,local_120,
                                  dictEnd);
  }
  else {
    sVar17 = (&local_f0)[uVar19 * 3];
    puVar24 = (ulong *)(sVar17 + uVar20);
    if (local_118 < op + (long)puVar24) goto LAB_0072a793;
    uVar19 = local_e8[uVar19 * 3];
    pBVar27 = op + uVar20;
    uVar6 = *(undefined8 *)(local_150 + 8);
    *(undefined8 *)op = *(undefined8 *)local_150;
    *(undefined8 *)(op + 8) = uVar6;
    if (0x10 < uVar20) {
      ZSTD_decompressBlock_internal_cold_1();
    }
    local_150 = pBVar18;
    pBVar18 = pBVar27 + -uVar19;
    if ((ulong)((long)pBVar27 - (long)prefixStart) < uVar19) {
      if ((ulong)((long)pBVar27 - (long)local_120) < uVar19) {
        puVar24 = (ulong *)0xffffffffffffffec;
      }
      else {
        lVar14 = (long)(pBVar27 + -uVar19) - (long)prefixStart;
        pBVar18 = dictEnd + lVar14;
        if (dictEnd < pBVar18 + sVar17) {
          memmove(pBVar27,pBVar18,-lVar14);
          pBVar27 = pBVar27 + -lVar14;
          sVar17 = sVar17 + lVar14;
          pBVar18 = prefixStart;
          goto LAB_0072a6d1;
        }
        memmove(pBVar27,pBVar18,sVar17);
      }
    }
    else {
LAB_0072a6d1:
      if (uVar19 < 0x10) {
        if (uVar19 < 8) {
          iVar28 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar19 * 4);
          *pBVar27 = *pBVar18;
          pBVar27[1] = pBVar18[1];
          pBVar27[2] = pBVar18[2];
          pBVar27[3] = pBVar18[3];
          pBVar21 = pBVar18 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar19 * 4);
          pBVar18 = pBVar18 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar19 * 4) -
                              (long)iVar28);
          *(undefined4 *)(pBVar27 + 4) = *(undefined4 *)pBVar21;
        }
        else {
          *(undefined8 *)pBVar27 = *(undefined8 *)pBVar18;
        }
        if (8 < sVar17) {
          pBVar21 = pBVar18 + 8;
          pBVar15 = pBVar27 + 8;
          if ((long)pBVar15 - (long)pBVar21 < 0x10) {
            do {
              *(undefined8 *)pBVar15 = *(undefined8 *)pBVar21;
              pBVar15 = pBVar15 + 8;
              pBVar21 = pBVar21 + 8;
            } while (pBVar15 < pBVar27 + sVar17);
          }
          else {
            uVar6 = *(undefined8 *)(pBVar18 + 0x10);
            *(undefined8 *)pBVar15 = *(undefined8 *)pBVar21;
            *(undefined8 *)(pBVar27 + 0x10) = uVar6;
            if (0x18 < (long)sVar17) {
              lVar14 = 0;
              do {
                uVar6 = *(undefined8 *)(pBVar18 + lVar14 + 0x18 + 8);
                pBVar21 = pBVar27 + lVar14 + 0x18;
                *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar18 + lVar14 + 0x18);
                *(undefined8 *)(pBVar21 + 8) = uVar6;
                uVar6 = *(undefined8 *)(pBVar18 + lVar14 + 0x28 + 8);
                *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar18 + lVar14 + 0x28);
                *(undefined8 *)(pBVar21 + 0x18) = uVar6;
                lVar14 = lVar14 + 0x20;
              } while (pBVar21 + 0x20 < pBVar27 + sVar17);
            }
          }
        }
      }
      else {
        uVar6 = *(undefined8 *)(pBVar18 + 8);
        *(undefined8 *)pBVar27 = *(undefined8 *)pBVar18;
        *(undefined8 *)(pBVar27 + 8) = uVar6;
        if (0x10 < (long)sVar17) {
          lVar14 = 0x10;
          do {
            uVar6 = *(undefined8 *)(pBVar18 + lVar14 + 8);
            pBVar21 = pBVar27 + lVar14;
            *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar18 + lVar14);
            *(undefined8 *)(pBVar21 + 8) = uVar6;
            uVar6 = *(undefined8 *)(pBVar18 + lVar14 + 0x10 + 8);
            *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar18 + lVar14 + 0x10);
            *(undefined8 *)(pBVar21 + 0x18) = uVar6;
            lVar14 = lVar14 + 0x20;
          } while (pBVar21 + 0x20 < pBVar27 + sVar17);
        }
      }
    }
  }
  bVar7 = false;
  puVar31 = (ulong *)0x0;
  if (puVar24 < (ulong *)0xffffffffffffff89) {
    puVar31 = puVar24;
  }
  op = op + (long)puVar31;
  if ((ulong *)0xffffffffffffff88 < puVar24) goto LAB_00729e4c;
  uVar22 = uVar22 + 1;
  puVar24 = local_128;
  goto joined_r0x0072a5f4;
LAB_0072a8f2:
  lVar14 = 0;
  do {
    (local_140->entropy).rep[lVar14] = (U32)local_180[lVar14];
    lVar14 = lVar14 + 1;
    bVar7 = true;
  } while (lVar14 != 3);
  goto LAB_00729e4c;
LAB_0072a31d:
  local_128 = puVar31;
  bVar7 = false;
  puVar24 = local_128;
  goto LAB_00729e4c;
LAB_00729e3b:
  if ((long)pbVar25 <= (long)uVar20) {
    local_118 = oend + -0x20;
    do {
      uVar19 = local_180[1];
      uVar30 = local_1d8.bitsConsumed;
      if (local_1d8.bitsConsumed < 0x41) {
        if (local_1d8.ptr < local_1d8.limitPtr) {
          if (local_1d8.ptr == local_1d8.start) goto LAB_00729f41;
          uVar22 = (int)local_1d8.ptr - (int)local_1d8.start;
          if (local_1d8.start <=
              (ulong *)((long)local_1d8.ptr - (ulong)(local_1d8.bitsConsumed >> 3))) {
            uVar22 = local_1d8.bitsConsumed >> 3;
          }
          uVar16 = local_1d8.bitsConsumed + uVar22 * -8;
        }
        else {
          uVar22 = local_1d8.bitsConsumed >> 3;
          uVar16 = local_1d8.bitsConsumed & 7;
        }
        local_1d8.ptr = (char *)((long)local_1d8.ptr - (ulong)uVar22);
        local_1d8.bitsConsumed = uVar16;
        local_1d8.bitContainer = *(size_t *)local_1d8.ptr;
      }
LAB_00729f41:
      uVar22 = (uint)uVar20;
      if ((0x40 < uVar30) || (local_fc <= (int)uVar22)) {
        if ((int)uVar22 < local_fc) {
          bVar7 = false;
          puVar24 = (ulong *)0xffffffffffffffec;
          goto LAB_00729e4c;
        }
        uVar22 = uVar22 - local_12c;
        puVar24 = local_128;
        goto joined_r0x0072a5f4;
      }
      uVar4 = local_1b0.table[local_1b0.state].nextState;
      bVar10 = local_1b0.table[local_1b0.state].nbAdditionalBits;
      bVar1 = local_1b0.table[local_1b0.state].nbBits;
      local_148 = (ulong)local_1b0.table[local_1b0.state].baseValue;
      uVar5 = local_190.table[local_190.state].nextState;
      bVar12 = local_190.table[local_190.state].nbAdditionalBits;
      bVar2 = local_190.table[local_190.state].nbBits;
      local_110 = (ulong)local_190.table[local_190.state].baseValue;
      bVar11 = local_1a0.table[local_1a0.state].nbAdditionalBits;
      bVar3 = local_1a0.table[local_1a0.state].nbBits;
      bVar13 = (byte)local_1d8.bitsConsumed;
      if (bVar11 < 2) {
        if (bVar11 == 0) {
          if (local_148 == 0) {
            local_180[1] = local_180[0];
            local_158 = uVar19;
            local_180[0] = uVar19;
          }
          else {
            local_158 = local_180[0];
          }
        }
        else {
          local_1d8.bitsConsumed = local_1d8.bitsConsumed + 1;
          lVar14 = (ulong)(local_1a0.table[local_1a0.state].baseValue + (uint)(local_148 == 0)) -
                   ((long)(local_1d8.bitContainer << (bVar13 & 0x3f)) >> 0x3f);
          if (lVar14 == 3) {
            local_158 = local_180[0] - 1;
          }
          else {
            local_158 = local_180[lVar14];
          }
          local_158 = local_158 + (local_158 == 0);
          if (lVar14 != 1) {
            local_180[2] = local_180[1];
          }
          local_180[1] = local_180[0];
          local_180[0] = local_158;
        }
      }
      else {
        local_160 = (ulong *)(ulong)uVar4;
        local_1d8.bitsConsumed = local_1d8.bitsConsumed + bVar11;
        local_158 = ((local_1d8.bitContainer << (bVar13 & 0x3f)) >> (-bVar11 & 0x3f)) +
                    (ulong)local_1a0.table[local_1a0.state].baseValue;
        local_180[1] = local_180[0];
        local_180[2] = uVar19;
        local_180[0] = local_158;
      }
      if (bVar12 != 0) {
        bVar13 = (byte)local_1d8.bitsConsumed;
        local_1d8.bitsConsumed = local_1d8.bitsConsumed + bVar12;
        local_110 = (ulong)local_190.table[local_190.state].baseValue +
                    ((local_1d8.bitContainer << (bVar13 & 0x3f)) >> (-bVar12 & 0x3f));
      }
      puVar24 = (ulong *)(ulong)local_1a0.table[local_1a0.state].nextState;
      local_180[0] = local_158;
      if (0x1e < (byte)(bVar12 + bVar10 + bVar11)) {
        local_160 = (ulong *)(ulong)local_1a0.table[local_1a0.state].nextState;
        BIT_reloadDStream(&local_1d8);
        puVar24 = local_160;
      }
      if (bVar10 != 0) {
        bVar12 = (byte)local_1d8.bitsConsumed;
        local_1d8.bitsConsumed = local_1d8.bitsConsumed + bVar10;
        local_148 = local_148 + ((local_1d8.bitContainer << (bVar12 & 0x3f)) >> (-bVar10 & 0x3f));
      }
      iVar28 = bVar1 + local_1d8.bitsConsumed;
      iVar29 = iVar28 + (uint)bVar2;
      local_1b0.state =
           (ulong)((uint)(local_1d8.bitContainer >> (-(char)iVar28 & 0x3fU)) & BIT_mask[bVar1]) +
           (long)(ulong)uVar4;
      uVar30 = iVar29 + (uint)bVar3;
      local_190.state =
           (ulong)((uint)(local_1d8.bitContainer >> (-(char)iVar29 & 0x3fU)) & BIT_mask[(uint)bVar2]
                  ) + (ulong)uVar5;
      local_1a0.state =
           (ulong)((uint)(local_1d8.bitContainer >> (-(char)uVar30 & 0x3fU)) & BIT_mask[(uint)bVar3]
                  ) + (long)puVar24;
      local_1d8.bitsConsumed = uVar30;
      uVar19 = (ulong)(uVar22 & 7);
      puVar24 = &local_f8 + uVar19 * 3;
      uVar20 = *puVar24;
      pBVar18 = local_150 + uVar20;
      if (local_138 < pBVar18) {
LAB_0072a336:
        sequence.matchLength._0_4_ = (int)(&local_f0)[uVar19 * 3];
        sequence.litLength = *puVar24;
        sequence.matchLength._4_4_ = (int)((&local_f0)[uVar19 * 3] >> 0x20);
        sequence.offset = local_e8[uVar19 * 3];
        puVar31 = (ulong *)ZSTD_execSequenceEnd
                                     (op,oend,sequence,&local_150,local_138,prefixStart,local_120,
                                      dictEnd);
      }
      else {
        sVar17 = (&local_f0)[uVar19 * 3];
        puVar31 = (ulong *)(sVar17 + uVar20);
        if (local_118 < (byte *)((long)puVar31 + (long)op)) goto LAB_0072a336;
        uVar19 = local_e8[uVar19 * 3];
        pBVar27 = op + uVar20;
        uVar6 = *(undefined8 *)(local_150 + 8);
        *(undefined8 *)op = *(undefined8 *)local_150;
        *(undefined8 *)(op + 8) = uVar6;
        if (0x10 < uVar20) {
          ZSTD_decompressBlock_internal_cold_2();
        }
        pBVar21 = pBVar27 + -uVar19;
        local_150 = pBVar18;
        if ((ulong)((long)pBVar27 - (long)prefixStart) < uVar19) {
          local_160 = puVar24;
          if ((ulong)((long)pBVar27 - (long)local_120) < uVar19) {
            puVar31 = (ulong *)0xffffffffffffffec;
            puVar24 = local_160;
          }
          else {
            lVar14 = (long)pBVar21 - (long)prefixStart;
            pBVar18 = dictEnd + lVar14;
            if (dictEnd < pBVar18 + sVar17) {
              memmove(pBVar27,pBVar18,-lVar14);
              pBVar27 = pBVar27 + -lVar14;
              sVar17 = sVar17 + lVar14;
              pBVar21 = prefixStart;
              puVar24 = local_160;
              goto LAB_0072a235;
            }
            memmove(pBVar27,pBVar18,sVar17);
            puVar24 = local_160;
          }
        }
        else {
LAB_0072a235:
          if (uVar19 < 0x10) {
            if (uVar19 < 8) {
              iVar28 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar19 * 4);
              *pBVar27 = *pBVar21;
              pBVar27[1] = pBVar21[1];
              pBVar27[2] = pBVar21[2];
              pBVar27[3] = pBVar21[3];
              pBVar18 = pBVar21 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar19 * 4);
              pBVar21 = pBVar21 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar19 * 4) -
                                  (long)iVar28);
              *(undefined4 *)(pBVar27 + 4) = *(undefined4 *)pBVar18;
            }
            else {
              *(undefined8 *)pBVar27 = *(undefined8 *)pBVar21;
            }
            if (8 < sVar17) {
              pBVar18 = pBVar21 + 8;
              pBVar15 = pBVar27 + 8;
              if ((long)pBVar15 - (long)pBVar18 < 0x10) {
                do {
                  *(undefined8 *)pBVar15 = *(undefined8 *)pBVar18;
                  pBVar15 = pBVar15 + 8;
                  pBVar18 = pBVar18 + 8;
                } while (pBVar15 < pBVar27 + sVar17);
              }
              else {
                uVar6 = *(undefined8 *)(pBVar21 + 0x10);
                *(undefined8 *)pBVar15 = *(undefined8 *)pBVar18;
                *(undefined8 *)(pBVar27 + 0x10) = uVar6;
                if (0x18 < (long)sVar17) {
                  lVar14 = 0;
                  do {
                    uVar6 = *(undefined8 *)(pBVar21 + lVar14 + 0x18 + 8);
                    pBVar18 = pBVar27 + lVar14 + 0x18;
                    *(undefined8 *)pBVar18 = *(undefined8 *)(pBVar21 + lVar14 + 0x18);
                    *(undefined8 *)(pBVar18 + 8) = uVar6;
                    uVar6 = *(undefined8 *)(pBVar21 + lVar14 + 0x28 + 8);
                    *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)(pBVar21 + lVar14 + 0x28);
                    *(undefined8 *)(pBVar18 + 0x18) = uVar6;
                    lVar14 = lVar14 + 0x20;
                  } while (pBVar18 + 0x20 < pBVar27 + sVar17);
                }
              }
            }
          }
          else {
            uVar6 = *(undefined8 *)(pBVar21 + 8);
            *(undefined8 *)pBVar27 = *(undefined8 *)pBVar21;
            *(undefined8 *)(pBVar27 + 8) = uVar6;
            if (0x10 < (long)sVar17) {
              lVar14 = 0x10;
              do {
                uVar6 = *(undefined8 *)(pBVar21 + lVar14 + 8);
                pBVar18 = pBVar27 + lVar14;
                *(undefined8 *)pBVar18 = *(undefined8 *)(pBVar21 + lVar14);
                *(undefined8 *)(pBVar18 + 8) = uVar6;
                uVar6 = *(undefined8 *)(pBVar21 + lVar14 + 0x10 + 8);
                *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)(pBVar21 + lVar14 + 0x10);
                *(undefined8 *)(pBVar18 + 0x18) = uVar6;
                lVar14 = lVar14 + 0x20;
              } while (pBVar18 + 0x20 < pBVar27 + sVar17);
            }
          }
        }
      }
      if ((ulong *)0xffffffffffffff88 < puVar31) goto LAB_0072a31d;
      local_108 = local_108 + local_148 + local_110;
      *puVar24 = local_148;
      puVar24[1] = local_110;
      puVar24[2] = local_158;
      op = op + (long)puVar31;
      uVar20 = (ulong)(uVar22 + 1);
    } while( true );
  }
LAB_00729e49:
  bVar7 = false;
  puVar24 = (ulong *)0xffffffffffffffec;
LAB_00729e4c:
  if (bVar7) {
LAB_00729e50:
    sVar17 = (long)local_138 - (long)local_150;
    uVar20 = (long)oend - (long)op;
    if (uVar20 < sVar17) {
      puVar24 = (ulong *)0xffffffffffffffba;
    }
    else if (op == (BYTE *)0x0) {
      op = (BYTE *)0x0;
    }
    else {
      memcpy(op,local_150,sVar17);
      op = op + sVar17;
    }
    if (sVar17 <= uVar20) {
      puVar24 = (ulong *)(op + -(long)dst);
    }
  }
  return (size_t)puVar24;
}

Assistant:

size_t
ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative.
     * (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || (dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN))));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    RETURN_ERROR_IF(srcSize >= ZSTD_BLOCKSIZE_MAX, srcSize_wrong, "");

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {
        /* These macros control at build-time which decompressor implementation
         * we use. If neither is defined, we do some inspection and dispatch at
         * runtime.
         */
#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        int usePrefetchDecoder = dctx->ddictIsCold;
#endif
        int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

        RETURN_ERROR_IF(dst == NULL && nbSeq > 0, dstSize_tooSmall, "NULL not handled");

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if ( !usePrefetchDecoder
          && (!frame || (dctx->fParams.windowSize > (1<<24)))
          && (nbSeq>ADVANCED_SEQS) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            usePrefetchDecoder = (shareLongOffsets >= minShare);
        }
#endif

        dctx->ddictIsCold = 0;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if (usePrefetchDecoder)
#endif
#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT
            return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset, frame);
#endif

#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG
        /* else */
        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset, frame);
#endif
    }
}